

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

roaring_bitmap_t * roaring_bitmap_or(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  uint8_t uVar1;
  byte bVar2;
  container_t *pcVar3;
  uint16_t *puVar4;
  roaring_bitmap_t *prVar5;
  uint uVar6;
  uint end_index;
  uint uVar7;
  uint16_t key;
  uint uVar8;
  roaring_array_t *prVar9;
  uint8_t type2;
  uint8_t type1;
  uint8_t result_type;
  uint8_t local_61;
  uint8_t local_60;
  uint8_t local_5f;
  ushort local_5e;
  uint local_5c;
  roaring_array_t *local_58;
  ulong local_50;
  ulong local_48;
  roaring_array_t *local_40;
  container_t *local_38;
  uint i;
  
  local_5f = '\0';
  uVar7 = (x1->high_low_container).size;
  local_50 = (ulong)uVar7;
  prVar5 = x2;
  if (uVar7 != 0) {
    uVar8 = (x2->high_low_container).size;
    local_48 = (ulong)uVar8;
    prVar5 = x1;
    if (uVar8 != 0) {
      local_40 = &roaring_bitmap_create_with_capacity(uVar8 + uVar7)->high_low_container;
      uVar7 = 0;
      bVar2 = 0;
      if (((x1->high_low_container).flags & 1) != 0) {
        bVar2 = (x2->high_low_container).flags & 1;
      }
      local_40->flags = local_40->flags & 0xfe | bVar2;
      key = *(x1->high_low_container).keys;
      puVar4 = (x2->high_low_container).keys;
      uVar8 = 0;
      local_58 = &x2->high_low_container;
LAB_0011170b:
      do {
        local_5e = *puVar4;
        i = uVar8;
        local_5c = uVar7;
        while( true ) {
          prVar9 = local_58;
          uVar7 = local_5c;
          uVar8 = i + 1;
          if (key == local_5e) break;
          if (local_5e <= key) {
            local_61 = local_58->typecodes[local_5c & 0xffff];
            pcVar3 = get_copy_of_container
                               (local_58->containers[local_5c & 0xffff],&local_61,
                                (_Bool)(local_58->flags & 1));
            uVar1 = local_61;
            if ((prVar9->flags & 1) != 0) {
              local_38 = pcVar3;
              ra_set_container_at_index(local_58,uVar7,pcVar3,local_61);
              pcVar3 = local_38;
            }
            ra_append(local_40,local_5e,pcVar3,uVar1);
            uVar7 = uVar7 + 1;
            uVar6 = (uint)local_48;
            prVar9 = local_40;
            end_index = uVar6;
            if (uVar7 == uVar6) goto LAB_00111944;
            puVar4 = (uint16_t *)((ulong)((uVar7 & 0xffff) * 2) + (long)local_58->keys);
            uVar8 = i;
            goto LAB_0011170b;
          }
          local_60 = (x1->high_low_container).typecodes[(ulong)i & 0xffff];
          pcVar3 = get_copy_of_container
                             ((x1->high_low_container).containers[(ulong)i & 0xffff],&local_60,
                              (_Bool)((x1->high_low_container).flags & 1));
          uVar1 = local_60;
          if (((x1->high_low_container).flags & 1) != 0) {
            ra_set_container_at_index(&x1->high_low_container,i,pcVar3,local_60);
          }
          prVar9 = local_40;
          ra_append(local_40,key,pcVar3,uVar1);
          if ((uint)local_50 == uVar8) {
            end_index = (uint)local_48;
            uVar6 = local_5c;
            goto LAB_001118f3;
          }
          key = (x1->high_low_container).keys[uVar8 & 0xffff];
          i = uVar8;
        }
        local_60 = (x1->high_low_container).typecodes[i & 0xffff];
        local_61 = local_58->typecodes[local_5c & 0xffff];
        pcVar3 = container_or((x1->high_low_container).containers[i & 0xffff],local_60,
                              local_58->containers[local_5c & 0xffff],local_61,&local_5f);
        prVar9 = local_40;
        ra_append(local_40,key,pcVar3,local_5f);
        uVar7 = uVar7 + 1;
        end_index = (uint)local_48;
        uVar6 = uVar7;
        i = uVar8;
        if (((uint)local_50 == uVar8) || (uVar7 == end_index)) {
LAB_00111944:
          if (i == (uint)local_50) {
LAB_001118f3:
            bVar2 = local_58->flags;
            x1 = (roaring_bitmap_t *)local_58;
            i = uVar6;
          }
          else {
            if (uVar6 != end_index) {
              return (roaring_bitmap_t *)prVar9;
            }
            bVar2 = (x1->high_low_container).flags;
            end_index = (uint)local_50;
          }
          ra_append_copy_range(prVar9,&x1->high_low_container,i,end_index,(_Bool)(bVar2 & 1));
          return (roaring_bitmap_t *)prVar9;
        }
        key = (x1->high_low_container).keys[uVar8 & 0xffff];
        puVar4 = (uint16_t *)((ulong)((uVar7 & 0xffff) * 2) + (long)local_58->keys);
      } while( true );
    }
  }
  prVar5 = roaring_bitmap_copy(prVar5);
  return prVar5;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_or(const roaring_bitmap_t *x1,
                                    const roaring_bitmap_t *x2) {
    uint8_t result_type = 0;
    const int length1 = x1->high_low_container.size,
              length2 = x2->high_low_container.size;
    if (0 == length1) {
        return roaring_bitmap_copy(x2);
    }
    if (0 == length2) {
        return roaring_bitmap_copy(x1);
    }
    roaring_bitmap_t *answer =
        roaring_bitmap_create_with_capacity(length1 + length2);
    roaring_bitmap_set_copy_on_write(answer, is_cow(x1) && is_cow(x2));
    int pos1 = 0, pos2 = 0;
    uint8_t type1, type2;
    uint16_t s1 = ra_get_key_at_index(&x1->high_low_container, pos1);
    uint16_t s2 = ra_get_key_at_index(&x2->high_low_container, pos2);
    while (true) {
        if (s1 == s2) {
            container_t *c1 = ra_get_container_at_index(
                                    &x1->high_low_container, pos1, &type1);
            container_t *c2 = ra_get_container_at_index(
                                    &x2->high_low_container, pos2, &type2);
            container_t *c = container_or(c1, type1, c2, type2, &result_type);

            // since we assume that the initial containers are non-empty, the
            // result here
            // can only be non-empty
            ra_append(&answer->high_low_container, s1, c, result_type);
            ++pos1;
            ++pos2;
            if (pos1 == length1) break;
            if (pos2 == length2) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, pos1);
            s2 = ra_get_key_at_index(&x2->high_low_container, pos2);

        } else if (s1 < s2) {  // s1 < s2
            container_t *c1 = ra_get_container_at_index(
                                    &x1->high_low_container, pos1, &type1);
            // c1 = container_clone(c1, type1);
            c1 = get_copy_of_container(c1, &type1, is_cow(x1));
            if (is_cow(x1)) {
                ra_set_container_at_index(&x1->high_low_container, pos1, c1,
                                          type1);
            }
            ra_append(&answer->high_low_container, s1, c1, type1);
            pos1++;
            if (pos1 == length1) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, pos1);

        } else {  // s1 > s2
            container_t *c2 = ra_get_container_at_index(
                                    &x2->high_low_container, pos2, &type2);
            // c2 = container_clone(c2, type2);
            c2 = get_copy_of_container(c2, &type2, is_cow(x2));
            if (is_cow(x2)) {
                ra_set_container_at_index(&x2->high_low_container, pos2, c2,
                                          type2);
            }
            ra_append(&answer->high_low_container, s2, c2, type2);
            pos2++;
            if (pos2 == length2) break;
            s2 = ra_get_key_at_index(&x2->high_low_container, pos2);
        }
    }
    if (pos1 == length1) {
        ra_append_copy_range(&answer->high_low_container,
                             &x2->high_low_container, pos2, length2,
                             is_cow(x2));
    } else if (pos2 == length2) {
        ra_append_copy_range(&answer->high_low_container,
                             &x1->high_low_container, pos1, length1,
                             is_cow(x1));
    }
    return answer;
}